

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,size_t n)

{
  Image *pIVar1;
  ulong in_RSI;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RDI;
  int i;
  Image *ra;
  Image *in_stack_ffffffffffffffc8;
  Image *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pIVar1 = pmr::polymorphic_allocator<pbrt::Image>::allocate_object<pbrt::Image>
                       ((polymorphic_allocator<pbrt::Image> *)in_stack_ffffffffffffffd0,
                        (size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pIVar1 + local_1c;
      begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
                ((polymorphic_allocator<pbrt::Image> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,(Image *)0x889c28);
      begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Image>::destroy<pbrt::Image>
                ((polymorphic_allocator<pbrt::Image> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
    }
    pmr::polymorphic_allocator<pbrt::Image>::deallocate_object<pbrt::Image>
              ((polymorphic_allocator<pbrt::Image> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x889c70);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pIVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }